

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureTarget.cpp
# Opt level: O2

void __thiscall
Outputs::Display::OpenGL::TextureTarget::draw
          (TextureTarget *this,float aspect_ratio,float colour_threshold)

{
  unique_ptr<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
  *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  Shader *pSVar3;
  int iVar4;
  GLint GVar5;
  GLint GVar6;
  ostream *poVar7;
  socklen_t in_ECX;
  sockaddr *in_RDX;
  sockaddr *__addr;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  int in_ESI;
  pointer __p;
  string *name;
  char *pcVar8;
  undefined4 in_XMM0_Db;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  allocator<char> local_9d;
  float local_9c;
  string local_98;
  uint uStack_78;
  undefined4 local_74;
  float local_70;
  undefined4 local_6c;
  uint local_68;
  undefined4 local_64;
  float local_60;
  undefined4 local_5c;
  float local_58;
  undefined4 uStack_54;
  char *fragment_shader;
  char *vertex_shader;
  
  local_9c = colour_threshold;
  if ((this->pixel_shader_)._M_t.
      super___uniq_ptr_impl<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
      ._M_t.
      super__Tuple_impl<0UL,_Outputs::Display::OpenGL::Shader_*,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
      .super__Head_base<0UL,_Outputs::Display::OpenGL::Shader_*,_false>._M_head_impl ==
      (Shader *)0x0) {
    this_00 = &this->pixel_shader_;
    vertex_shader =
         "#version 150\nin vec2 texCoord;in vec2 position;out vec2 texCoordVarying;void main(void){texCoordVarying = texCoord;gl_Position = vec4(position, 0.0, 1.0);}"
    ;
    fragment_shader =
         "#version 150\nin vec2 texCoordVarying;uniform sampler2D texID;uniform float threshold;out vec4 fragColour;void main(void){fragColour = clamp(texture(texID, texCoordVarying), threshold, 1.0);}"
    ;
    local_58 = aspect_ratio;
    uStack_54 = in_XMM0_Db;
    std::make_unique<Outputs::Display::OpenGL::Shader,char_const*&,char_const*&>
              ((char **)&local_98,&vertex_shader);
    __p = (pointer)CONCAT44(local_98._M_dataplus._M_p._4_4_,(uint)local_98._M_dataplus._M_p);
    local_98._M_dataplus._M_p._0_4_ = 0;
    local_98._M_dataplus._M_p._4_4_ = 0;
    std::
    __uniq_ptr_impl<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
    ::reset((__uniq_ptr_impl<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
             *)this_00,__p);
    iVar4 = (int)__p;
    std::
    unique_ptr<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
    ::~unique_ptr((unique_ptr<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
                   *)&local_98);
    Shader::bind((this->pixel_shader_)._M_t.
                 super___uniq_ptr_impl<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Outputs::Display::OpenGL::Shader_*,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
                 .super__Head_base<0UL,_Outputs::Display::OpenGL::Shader_*,_false>._M_head_impl,
                 iVar4,__addr,in_ECX);
    glGenVertexArrays(1,&this->drawing_vertex_array_);
    iVar4 = glGetError();
    if (iVar4 != 0) {
      switch(iVar4) {
      case 0x500:
        pcVar8 = "GL_INVALID_ENUM";
        break;
      case 0x501:
        pcVar8 = "GL_INVALID_VALUE";
        break;
      case 0x502:
        pcVar8 = "GL_INVALID_OPERATION";
        break;
      default:
        poVar7 = std::operator<<((ostream *)&std::cerr,"Error ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        goto LAB_0037d152;
      case 0x505:
        pcVar8 = "GL_OUT_OF_MEMORY";
        break;
      case 0x506:
        pcVar8 = "GL_INVALID_FRAMEBUFFER_OPERATION";
      }
      std::operator<<((ostream *)&std::cerr,pcVar8);
LAB_0037d152:
      poVar7 = std::operator<<((ostream *)&std::cerr," at line ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x80);
      poVar7 = std::operator<<(poVar7," in ");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                              );
      std::endl<char,std::char_traits<char>>(poVar7);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                    ,0x80,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
    }
    glGenBuffers(1,&this->drawing_array_buffer_);
    iVar4 = glGetError();
    if (iVar4 != 0) {
      switch(iVar4) {
      case 0x500:
        pcVar8 = "GL_INVALID_ENUM";
        break;
      case 0x501:
        pcVar8 = "GL_INVALID_VALUE";
        break;
      case 0x502:
        pcVar8 = "GL_INVALID_OPERATION";
        break;
      default:
        poVar7 = std::operator<<((ostream *)&std::cerr,"Error ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        goto LAB_0037d1f9;
      case 0x505:
        pcVar8 = "GL_OUT_OF_MEMORY";
        break;
      case 0x506:
        pcVar8 = "GL_INVALID_FRAMEBUFFER_OPERATION";
      }
      std::operator<<((ostream *)&std::cerr,pcVar8);
LAB_0037d1f9:
      poVar7 = std::operator<<((ostream *)&std::cerr," at line ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x81);
      poVar7 = std::operator<<(poVar7," in ");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                              );
      std::endl<char,std::char_traits<char>>(poVar7);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                    ,0x81,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
    }
    glBindVertexArray(this->drawing_vertex_array_);
    iVar4 = glGetError();
    if (iVar4 != 0) {
      switch(iVar4) {
      case 0x500:
        pcVar8 = "GL_INVALID_ENUM";
        break;
      case 0x501:
        pcVar8 = "GL_INVALID_VALUE";
        break;
      case 0x502:
        pcVar8 = "GL_INVALID_OPERATION";
        break;
      default:
        poVar7 = std::operator<<((ostream *)&std::cerr,"Error ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        goto LAB_0037d2a0;
      case 0x505:
        pcVar8 = "GL_OUT_OF_MEMORY";
        break;
      case 0x506:
        pcVar8 = "GL_INVALID_FRAMEBUFFER_OPERATION";
      }
      std::operator<<((ostream *)&std::cerr,pcVar8);
LAB_0037d2a0:
      poVar7 = std::operator<<((ostream *)&std::cerr," at line ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x83);
      poVar7 = std::operator<<(poVar7," in ");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                              );
      std::endl<char,std::char_traits<char>>(poVar7);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                    ,0x83,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
    }
    glBindBuffer(0x8892,this->drawing_array_buffer_);
    iVar4 = glGetError();
    if (iVar4 != 0) {
      switch(iVar4) {
      case 0x500:
        pcVar8 = "GL_INVALID_ENUM";
        break;
      case 0x501:
        pcVar8 = "GL_INVALID_VALUE";
        break;
      case 0x502:
        pcVar8 = "GL_INVALID_OPERATION";
        break;
      default:
        poVar7 = std::operator<<((ostream *)&std::cerr,"Error ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        goto LAB_0037d347;
      case 0x505:
        pcVar8 = "GL_OUT_OF_MEMORY";
        break;
      case 0x506:
        pcVar8 = "GL_INVALID_FRAMEBUFFER_OPERATION";
      }
      std::operator<<((ostream *)&std::cerr,pcVar8);
LAB_0037d347:
      poVar7 = std::operator<<((ostream *)&std::cerr," at line ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x84);
      poVar7 = std::operator<<(poVar7," in ");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                              );
      std::endl<char,std::char_traits<char>>(poVar7);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                    ,0x84,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
    }
    pSVar3 = (this_00->_M_t).
             super___uniq_ptr_impl<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
             ._M_t.
             super__Tuple_impl<0UL,_Outputs::Display::OpenGL::Shader_*,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
             .super__Head_base<0UL,_Outputs::Display::OpenGL::Shader_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"position",&local_9d);
    GVar5 = Shader::get_attrib_location(pSVar3,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    pSVar3 = (this_00->_M_t).
             super___uniq_ptr_impl<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
             ._M_t.
             super__Tuple_impl<0UL,_Outputs::Display::OpenGL::Shader_*,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
             .super__Head_base<0UL,_Outputs::Display::OpenGL::Shader_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"texCoord",&local_9d);
    GVar6 = Shader::get_attrib_location(pSVar3,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    glEnableVertexAttribArray(GVar5);
    iVar4 = glGetError();
    if (iVar4 != 0) {
      switch(iVar4) {
      case 0x500:
        pcVar8 = "GL_INVALID_ENUM";
        break;
      case 0x501:
        pcVar8 = "GL_INVALID_VALUE";
        break;
      case 0x502:
        pcVar8 = "GL_INVALID_OPERATION";
        break;
      default:
        poVar7 = std::operator<<((ostream *)&std::cerr,"Error ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        goto LAB_0037d3ee;
      case 0x505:
        pcVar8 = "GL_OUT_OF_MEMORY";
        break;
      case 0x506:
        pcVar8 = "GL_INVALID_FRAMEBUFFER_OPERATION";
      }
      std::operator<<((ostream *)&std::cerr,pcVar8);
LAB_0037d3ee:
      poVar7 = std::operator<<((ostream *)&std::cerr," at line ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x89);
      poVar7 = std::operator<<(poVar7," in ");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                              );
      std::endl<char,std::char_traits<char>>(poVar7);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                    ,0x89,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
    }
    glEnableVertexAttribArray(GVar6);
    iVar4 = glGetError();
    if (iVar4 != 0) {
      switch(iVar4) {
      case 0x500:
        pcVar8 = "GL_INVALID_ENUM";
        break;
      case 0x501:
        pcVar8 = "GL_INVALID_VALUE";
        break;
      case 0x502:
        pcVar8 = "GL_INVALID_OPERATION";
        break;
      default:
        poVar7 = std::operator<<((ostream *)&std::cerr,"Error ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        goto LAB_0037d495;
      case 0x505:
        pcVar8 = "GL_OUT_OF_MEMORY";
        break;
      case 0x506:
        pcVar8 = "GL_INVALID_FRAMEBUFFER_OPERATION";
      }
      std::operator<<((ostream *)&std::cerr,pcVar8);
LAB_0037d495:
      poVar7 = std::operator<<((ostream *)&std::cerr," at line ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x8a);
      poVar7 = std::operator<<(poVar7," in ");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                              );
      std::endl<char,std::char_traits<char>>(poVar7);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                    ,0x8a,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
    }
    glVertexAttribPointer(GVar5,2,0x1406,0,0x10,0);
    iVar4 = glGetError();
    if (iVar4 != 0) {
      switch(iVar4) {
      case 0x500:
        pcVar8 = "GL_INVALID_ENUM";
        break;
      case 0x501:
        pcVar8 = "GL_INVALID_VALUE";
        break;
      case 0x502:
        pcVar8 = "GL_INVALID_OPERATION";
        break;
      default:
        poVar7 = std::operator<<((ostream *)&std::cerr,"Error ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        goto LAB_0037d53c;
      case 0x505:
        pcVar8 = "GL_OUT_OF_MEMORY";
        break;
      case 0x506:
        pcVar8 = "GL_INVALID_FRAMEBUFFER_OPERATION";
      }
      std::operator<<((ostream *)&std::cerr,pcVar8);
LAB_0037d53c:
      poVar7 = std::operator<<((ostream *)&std::cerr," at line ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x8d);
      poVar7 = std::operator<<(poVar7," in ");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                              );
      std::endl<char,std::char_traits<char>>(poVar7);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                    ,0x8d,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
    }
    in_ECX = 0;
    glVertexAttribPointer(GVar6,2,0x1406,0,0x10,8);
    iVar4 = glGetError();
    if (iVar4 != 0) {
      switch(iVar4) {
      case 0x500:
        pcVar8 = "GL_INVALID_ENUM";
        break;
      case 0x501:
        pcVar8 = "GL_INVALID_VALUE";
        break;
      case 0x502:
        pcVar8 = "GL_INVALID_OPERATION";
        break;
      default:
        poVar7 = std::operator<<((ostream *)&std::cerr,"Error ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        goto LAB_0037d5e3;
      case 0x505:
        pcVar8 = "GL_OUT_OF_MEMORY";
        break;
      case 0x506:
        pcVar8 = "GL_INVALID_FRAMEBUFFER_OPERATION";
      }
      std::operator<<((ostream *)&std::cerr,pcVar8);
LAB_0037d5e3:
      poVar7 = std::operator<<((ostream *)&std::cerr," at line ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x8e);
      poVar7 = std::operator<<(poVar7," in ");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                              );
      std::endl<char,std::char_traits<char>>(poVar7);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                    ,0x8e,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
    }
    pSVar3 = (this_00->_M_t).
             super___uniq_ptr_impl<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
             ._M_t.
             super__Tuple_impl<0UL,_Outputs::Display::OpenGL::Shader_*,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
             .super__Head_base<0UL,_Outputs::Display::OpenGL::Shader_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"texID",&local_9d);
    GVar5 = Shader::get_uniform_location(pSVar3,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    glUniform1i(GVar5,this->texture_unit_ - 0x84c0);
    iVar4 = glGetError();
    if (iVar4 != 0) {
      switch(iVar4) {
      case 0x500:
        pcVar8 = "GL_INVALID_ENUM";
        break;
      case 0x501:
        pcVar8 = "GL_INVALID_VALUE";
        break;
      case 0x502:
        pcVar8 = "GL_INVALID_OPERATION";
        break;
      default:
        poVar7 = std::operator<<((ostream *)&std::cerr,"Error ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        goto LAB_0037d68a;
      case 0x505:
        pcVar8 = "GL_OUT_OF_MEMORY";
        break;
      case 0x506:
        pcVar8 = "GL_INVALID_FRAMEBUFFER_OPERATION";
      }
      std::operator<<((ostream *)&std::cerr,pcVar8);
LAB_0037d68a:
      poVar7 = std::operator<<((ostream *)&std::cerr," at line ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x91);
      poVar7 = std::operator<<(poVar7," in ");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                              );
      std::endl<char,std::char_traits<char>>(poVar7);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                    ,0x91,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
    }
    pSVar3 = (this_00->_M_t).
             super___uniq_ptr_impl<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
             ._M_t.
             super__Tuple_impl<0UL,_Outputs::Display::OpenGL::Shader_*,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
             .super__Head_base<0UL,_Outputs::Display::OpenGL::Shader_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"threshold",&local_9d);
    name = &local_98;
    GVar5 = Shader::get_uniform_location(pSVar3,name);
    in_ESI = (int)name;
    this->threshold_uniform_ = GVar5;
    std::__cxx11::string::~string((string *)&local_98);
    in_RDX = extraout_RDX;
    aspect_ratio = local_58;
    in_XMM0_Db = uStack_54;
  }
  if ((this->set_aspect_ratio_ != aspect_ratio) ||
     (NAN(this->set_aspect_ratio_) || NAN(aspect_ratio))) {
    this->set_aspect_ratio_ = aspect_ratio;
    local_98._M_string_length._4_4_ = 0;
    uVar1 = this->width_;
    uVar2 = this->height_;
    fVar9 = (float)(int)uVar2;
    local_70 = (float)(int)uVar1 / (float)this->expanded_width_;
    local_6c = 0;
    auVar10._4_4_ = (float)(int)uVar1 / fVar9;
    auVar10._0_4_ = fVar9;
    auVar10._8_4_ = fVar9;
    auVar10._12_4_ = fVar9;
    local_98._M_dataplus._M_p._4_4_ = 0xbf800000;
    local_98._M_string_length._0_4_ = 0;
    auVar11._4_4_ = aspect_ratio;
    auVar11._0_4_ = (float)this->expanded_height_;
    auVar11._8_4_ = 0;
    auVar11._12_4_ = in_XMM0_Db;
    auVar11 = divps(auVar10,auVar11);
    local_98.field_2._12_4_ = auVar11._0_4_;
    uStack_78 = auVar11._4_4_;
    local_98.field_2._M_allocated_capacity._4_4_ = 0x3f800000;
    local_98.field_2._8_4_ = 0;
    local_98._M_dataplus._M_p._0_4_ = uStack_78 ^ 0x80000000;
    local_74 = 0xbf800000;
    local_64 = 0x3f800000;
    local_98.field_2._M_allocated_capacity._0_4_ = (uint)local_98._M_dataplus._M_p;
    local_68 = uStack_78;
    local_60 = local_70;
    local_5c = local_98.field_2._12_4_;
    glBindBuffer(0x8892,this->drawing_array_buffer_);
    iVar4 = glGetError();
    if (iVar4 != 0) {
      switch(iVar4) {
      case 0x500:
        pcVar8 = "GL_INVALID_ENUM";
        break;
      case 0x501:
        pcVar8 = "GL_INVALID_VALUE";
        break;
      case 0x502:
        pcVar8 = "GL_INVALID_OPERATION";
        break;
      default:
        poVar7 = std::operator<<((ostream *)&std::cerr,"Error ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        goto LAB_0037cf9d;
      case 0x505:
        pcVar8 = "GL_OUT_OF_MEMORY";
        break;
      case 0x506:
        pcVar8 = "GL_INVALID_FRAMEBUFFER_OPERATION";
      }
      std::operator<<((ostream *)&std::cerr,pcVar8);
LAB_0037cf9d:
      poVar7 = std::operator<<((ostream *)&std::cerr," at line ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xae);
      poVar7 = std::operator<<(poVar7," in ");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                              );
      std::endl<char,std::char_traits<char>>(poVar7);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                    ,0xae,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
    }
    in_ESI = 0x40;
    in_ECX = 0x88e4;
    glBufferData(0x8892,0x40,&local_98);
    iVar4 = glGetError();
    in_RDX = extraout_RDX_00;
    if (iVar4 != 0) {
      switch(iVar4) {
      case 0x500:
        pcVar8 = "GL_INVALID_ENUM";
        break;
      case 0x501:
        pcVar8 = "GL_INVALID_VALUE";
        break;
      case 0x502:
        pcVar8 = "GL_INVALID_OPERATION";
        break;
      default:
        poVar7 = std::operator<<((ostream *)&std::cerr,"Error ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        goto LAB_0037d044;
      case 0x505:
        pcVar8 = "GL_OUT_OF_MEMORY";
        break;
      case 0x506:
        pcVar8 = "GL_INVALID_FRAMEBUFFER_OPERATION";
      }
      std::operator<<((ostream *)&std::cerr,pcVar8);
LAB_0037d044:
      poVar7 = std::operator<<((ostream *)&std::cerr," at line ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xaf);
      poVar7 = std::operator<<(poVar7," in ");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                              );
      std::endl<char,std::char_traits<char>>(poVar7);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                    ,0xaf,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
    }
  }
  Shader::bind((this->pixel_shader_)._M_t.
               super___uniq_ptr_impl<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
               ._M_t.
               super__Tuple_impl<0UL,_Outputs::Display::OpenGL::Shader_*,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
               .super__Head_base<0UL,_Outputs::Display::OpenGL::Shader_*,_false>._M_head_impl,in_ESI
               ,in_RDX,in_ECX);
  glUniform1f(local_9c,this->threshold_uniform_);
  iVar4 = glGetError();
  if (iVar4 == 0) {
    glBindVertexArray(this->drawing_vertex_array_);
    iVar4 = glGetError();
    if (iVar4 != 0) {
      switch(iVar4) {
      case 0x500:
        pcVar8 = "GL_INVALID_ENUM";
        break;
      case 0x501:
        pcVar8 = "GL_INVALID_VALUE";
        break;
      case 0x502:
        pcVar8 = "GL_INVALID_OPERATION";
        break;
      default:
        poVar7 = std::operator<<((ostream *)&std::cerr,"Error ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        goto LAB_0037ce4f;
      case 0x505:
        pcVar8 = "GL_OUT_OF_MEMORY";
        break;
      case 0x506:
        pcVar8 = "GL_INVALID_FRAMEBUFFER_OPERATION";
      }
      std::operator<<((ostream *)&std::cerr,pcVar8);
LAB_0037ce4f:
      poVar7 = std::operator<<((ostream *)&std::cerr," at line ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xb5);
      poVar7 = std::operator<<(poVar7," in ");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                              );
      std::endl<char,std::char_traits<char>>(poVar7);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                    ,0xb5,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
    }
    glDrawArrays(5,0,4);
    iVar4 = glGetError();
    if (iVar4 == 0) {
      return;
    }
    switch(iVar4) {
    case 0x500:
      pcVar8 = "GL_INVALID_ENUM";
      break;
    case 0x501:
      pcVar8 = "GL_INVALID_VALUE";
      break;
    case 0x502:
      pcVar8 = "GL_INVALID_OPERATION";
      break;
    default:
      poVar7 = std::operator<<((ostream *)&std::cerr,"Error ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      goto LAB_0037cef6;
    case 0x505:
      pcVar8 = "GL_OUT_OF_MEMORY";
      break;
    case 0x506:
      pcVar8 = "GL_INVALID_FRAMEBUFFER_OPERATION";
    }
    std::operator<<((ostream *)&std::cerr,pcVar8);
LAB_0037cef6:
    poVar7 = std::operator<<((ostream *)&std::cerr," at line ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xb6);
    poVar7 = std::operator<<(poVar7," in ");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                            );
    std::endl<char,std::char_traits<char>>(poVar7);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                  ,0xb6,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
  }
  switch(iVar4) {
  case 0x500:
    pcVar8 = "GL_INVALID_ENUM";
    break;
  case 0x501:
    pcVar8 = "GL_INVALID_VALUE";
    break;
  case 0x502:
    pcVar8 = "GL_INVALID_OPERATION";
    break;
  default:
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    goto LAB_0037cda8;
  case 0x505:
    pcVar8 = "GL_OUT_OF_MEMORY";
    break;
  case 0x506:
    pcVar8 = "GL_INVALID_FRAMEBUFFER_OPERATION";
  }
  std::operator<<((ostream *)&std::cerr,pcVar8);
LAB_0037cda8:
  poVar7 = std::operator<<((ostream *)&std::cerr," at line ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xb3);
  poVar7 = std::operator<<(poVar7," in ");
  poVar7 = std::operator<<(poVar7,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                          );
  std::endl<char,std::char_traits<char>>(poVar7);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                ,0xb3,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
}

Assistant:

void TextureTarget::draw(float aspect_ratio, float colour_threshold) const {
	if(!pixel_shader_) {
		const char *vertex_shader =
			"#version 150\n"

			"in vec2 texCoord;"
			"in vec2 position;"

			"out vec2 texCoordVarying;"

			"void main(void)"
			"{"
				"texCoordVarying = texCoord;"
				"gl_Position = vec4(position, 0.0, 1.0);"
			"}";
		const char *fragment_shader =
			"#version 150\n"

			"in vec2 texCoordVarying;"

			"uniform sampler2D texID;"
			"uniform float threshold;"

			"out vec4 fragColour;"

			"void main(void)"
			"{"
				"fragColour = clamp(texture(texID, texCoordVarying), threshold, 1.0);"
			"}";
		pixel_shader_ = std::make_unique<Shader>(vertex_shader, fragment_shader);
		pixel_shader_->bind();

		test_gl(glGenVertexArrays, 1, &drawing_vertex_array_);
		test_gl(glGenBuffers, 1, &drawing_array_buffer_);

		test_gl(glBindVertexArray, drawing_vertex_array_);
		test_gl(glBindBuffer, GL_ARRAY_BUFFER, drawing_array_buffer_);

		const GLint position_attribute	= pixel_shader_->get_attrib_location("position");
		const GLint tex_coord_attribute	= pixel_shader_->get_attrib_location("texCoord");

		test_gl(glEnableVertexAttribArray, GLuint(position_attribute));
		test_gl(glEnableVertexAttribArray, GLuint(tex_coord_attribute));

		const GLsizei vertex_stride = 4 * sizeof(GLfloat);
		test_gl(glVertexAttribPointer, GLuint(position_attribute),	2, GL_FLOAT,	GL_FALSE,	vertex_stride,	(void *)0);
		test_gl(glVertexAttribPointer, GLuint(tex_coord_attribute),	2, GL_FLOAT,	GL_FALSE,	vertex_stride,	(void *)(2 * sizeof(GLfloat)));

		const GLint texIDUniform = pixel_shader_->get_uniform_location("texID");
		test_gl(glUniform1i, texIDUniform, GLint(texture_unit_ - GL_TEXTURE0));

		threshold_uniform_ = pixel_shader_->get_uniform_location("threshold");
	}

	if(set_aspect_ratio_ != aspect_ratio) {
		set_aspect_ratio_ = aspect_ratio;
		float buffer[4*4];

		// establish texture coordinates
		buffer[2] = 0.0f;
		buffer[3] = 0.0f;
		buffer[6] = 0.0f;
		buffer[7] = float(height_) / float(expanded_height_);
		buffer[10] = float(width_) / float(expanded_width_);
		buffer[11] = 0.0f;
		buffer[14] = buffer[10];
		buffer[15] = buffer[7];

		// determine positions; rule is to keep the same height and centre
		float internal_aspect_ratio = float(width_) / float(height_);
		float aspect_ratio_ratio = internal_aspect_ratio / aspect_ratio;

		buffer[0] = -aspect_ratio_ratio;	buffer[1] = -1.0f;
		buffer[4] = -aspect_ratio_ratio;	buffer[5] = 1.0f;
		buffer[8] = aspect_ratio_ratio;		buffer[9] = -1.0f;
		buffer[12] = aspect_ratio_ratio;	buffer[13] = 1.0f;

		// upload buffer
		test_gl(glBindBuffer, GL_ARRAY_BUFFER, drawing_array_buffer_);
		test_gl(glBufferData, GL_ARRAY_BUFFER, sizeof(buffer), buffer, GL_STATIC_DRAW);
	}

	pixel_shader_->bind();
	test_gl(glUniform1f, threshold_uniform_, colour_threshold);

	test_gl(glBindVertexArray, drawing_vertex_array_);
	test_gl(glDrawArrays, GL_TRIANGLE_STRIP, 0, 4);
}